

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.hpp
# Opt level: O2

void duckdb::alp::AlpRDCompression<float,_false>::Compress
               (EXACT_TYPE *input_vector,idx_t n_values,State *state)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t i_1;
  uint16_t dictionary_key;
  uint16_t left_parts [1024];
  uint64_t right_parts [1024];
  
  bVar1 = state->right_bit_width;
  for (iVar7 = 0; n_values != iVar7; iVar7 = iVar7 + 1) {
    uVar3 = input_vector[iVar7];
    right_parts[iVar7] = (ulong)(~(uint)(-1L << (bVar1 & 0x3f)) & uVar3);
    left_parts[iVar7] = (uint16_t)(uVar3 >> (bVar1 & 0x1f));
  }
  iVar7 = 0;
  do {
    if (n_values == iVar7) {
      iVar7 = BitpackingPrimitives::GetRequiredSize(n_values,state->right_bit_width);
      iVar6 = BitpackingPrimitives::GetRequiredSize(n_values,state->left_bit_width);
      BitpackingPrimitives::PackBuffer<unsigned_short,false>
                (state->left_parts_encoded,left_parts,n_values,state->left_bit_width);
      BitpackingPrimitives::PackBuffer<unsigned_long,false>
                (state->right_parts_encoded,right_parts,n_values,state->right_bit_width);
      state->left_bit_packed_size = iVar6;
      state->right_bit_packed_size = iVar7;
      return;
    }
    dictionary_key = left_parts[iVar7];
    iVar4 = ::std::
            _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(state->left_parts_dict_map)._M_h,&dictionary_key);
    if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_short,_unsigned_short>,_false>.
        _M_cur == (__node_type *)0x0) {
      left_parts[iVar7] = (ushort)state->actual_dictionary_size;
LAB_004d73fa:
      uVar2 = state->exceptions_count;
      state->exceptions[uVar2] = dictionary_key;
      state->exceptions_positions[uVar2] = (uint16_t)iVar7;
      state->exceptions_count = uVar2 + 1;
    }
    else {
      pmVar5 = ::std::__detail::
               _Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&state->left_parts_dict_map,&dictionary_key);
      uVar2 = *pmVar5;
      bVar1 = state->actual_dictionary_size;
      left_parts[iVar7] = uVar2;
      if (bVar1 <= uVar2) goto LAB_004d73fa;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

static void Compress(const EXACT_TYPE *input_vector, idx_t n_values, State &state) {

		uint64_t right_parts[AlpRDConstants::ALP_VECTOR_SIZE];
		uint16_t left_parts[AlpRDConstants::ALP_VECTOR_SIZE];

		// Cutting the floating point values
		for (idx_t i = 0; i < n_values; i++) {
			EXACT_TYPE tmp = input_vector[i];
			right_parts[i] = tmp & ((1ULL << state.right_bit_width) - 1);
			left_parts[i] = UnsafeNumericCast<uint16_t>(tmp >> state.right_bit_width);
		}

		// Dictionary encoding for left parts
		for (idx_t i = 0; i < n_values; i++) {
			uint16_t dictionary_index;
			auto dictionary_key = left_parts[i];
			if (state.left_parts_dict_map.find(dictionary_key) == state.left_parts_dict_map.end()) {
				//! If not found on the dictionary we store the smallest non-key index as exception (the dict size)
				dictionary_index = state.actual_dictionary_size;
			} else {
				dictionary_index = state.left_parts_dict_map[dictionary_key];
			}
			left_parts[i] = dictionary_index;

			//! Left parts not found in the dictionary are stored as exceptions
			if (dictionary_index >= state.actual_dictionary_size) {
				state.exceptions[state.exceptions_count] = dictionary_key;
				state.exceptions_positions[state.exceptions_count] = UnsafeNumericCast<uint16_t>(i);
				state.exceptions_count++;
			}
		}

		auto right_bit_packed_size = BitpackingPrimitives::GetRequiredSize(n_values, state.right_bit_width);
		auto left_bit_packed_size = BitpackingPrimitives::GetRequiredSize(n_values, state.left_bit_width);

		if (!EMPTY) {
			// Bitpacking Left and Right parts
			BitpackingPrimitives::PackBuffer<uint16_t, false>(state.left_parts_encoded, left_parts, n_values,
			                                                  state.left_bit_width);
			BitpackingPrimitives::PackBuffer<uint64_t, false>(state.right_parts_encoded, right_parts, n_values,
			                                                  state.right_bit_width);
		}

		state.left_bit_packed_size = left_bit_packed_size;
		state.right_bit_packed_size = right_bit_packed_size;
	}